

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void duckdb::BitpackingScanPartial<unsigned_short,short,unsigned_short>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  BitpackingScanState<unsigned_short,_short> *pBVar1;
  unsigned_short *puVar2;
  ulong uVar3;
  unsigned_long uVar4;
  BitpackingScanState<unsigned_short,_short> *in_RCX;
  ulong in_RDX;
  long in_R8;
  unsigned_short *current_result_ptr;
  data_ptr_t decompression_group_start_pointer;
  data_ptr_t current_position_ptr;
  idx_t to_scan;
  idx_t multiplier;
  idx_t i;
  unsigned_short *target_ptr;
  idx_t to_scan_2;
  idx_t remaining_1;
  unsigned_short *end;
  unsigned_short *begin;
  idx_t to_scan_1;
  idx_t remaining;
  idx_t offset_in_compression_group;
  idx_t scanned;
  bool skip_sign_extend;
  unsigned_short *result_data;
  BitpackingScanState<unsigned_short,_short> *scan_state;
  unsigned_short *in_stack_ffffffffffffff48;
  SegmentScanState *in_stack_ffffffffffffff50;
  ulong local_90;
  undefined8 in_stack_ffffffffffffff78;
  VectorType vector_type_p;
  Vector *in_stack_ffffffffffffff80;
  ulong local_48;
  
  vector_type_p = (VectorType)((ulong)in_stack_ffffffffffffff78 >> 0x38);
  unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
  operator->((unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
              *)in_stack_ffffffffffffff50);
  pBVar1 = SegmentScanState::Cast<duckdb::BitpackingScanState<unsigned_short,short>>
                     (in_stack_ffffffffffffff50);
  puVar2 = FlatVector::GetData<unsigned_short>((Vector *)0xa8cced);
  Vector::SetVectorType(in_stack_ffffffffffffff80,vector_type_p);
  local_48 = 0;
  while (local_48 < in_RDX) {
    if (pBVar1->current_group_offset == 0x800) {
      BitpackingScanState<unsigned_short,_short>::LoadNextGroup(in_RCX);
    }
    uVar3 = pBVar1->current_group_offset & 0x1f;
    if ((pBVar1->current_group).mode == CONSTANT) {
      uVar4 = MinValue<unsigned_long>(in_RDX - local_48,0x800 - pBVar1->current_group_offset);
      ::std::fill<unsigned_short*,unsigned_short>
                ((unsigned_short *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                 (unsigned_short *)0xa8ce02);
      local_48 = uVar4 + local_48;
      pBVar1->current_group_offset = uVar4 + pBVar1->current_group_offset;
    }
    else if ((pBVar1->current_group).mode == CONSTANT_DELTA) {
      uVar4 = MinValue<unsigned_long>(in_RDX - local_48,0x800 - pBVar1->current_group_offset);
      for (local_90 = 0; local_90 < uVar4; local_90 = local_90 + 1) {
        puVar2[in_R8 + local_48 + local_90] =
             pBVar1->current_constant * ((short)pBVar1->current_group_offset + (short)local_90) +
             pBVar1->current_frame_of_reference;
      }
      local_48 = uVar4 + local_48;
      pBVar1->current_group_offset = uVar4 + pBVar1->current_group_offset;
    }
    else {
      uVar4 = MinValue<unsigned_long>(in_RDX - local_48,0x20 - uVar3);
      in_stack_ffffffffffffff50 =
           (SegmentScanState *)
           (pBVar1->current_group_ptr +
           ((pBVar1->current_group_offset * (ulong)pBVar1->current_width >> 3) -
           (uVar3 * pBVar1->current_width >> 3)));
      in_stack_ffffffffffffff48 = puVar2 + in_R8 + local_48;
      if ((uVar4 == 0x20) && (uVar3 == 0)) {
        data_ptr_cast<unsigned_short>(in_stack_ffffffffffffff48);
        BitpackingPrimitives::UnPackBlock<unsigned_short>
                  ((data_ptr_t)in_stack_ffffffffffffff50,(data_ptr_t)in_stack_ffffffffffffff48,'\0',
                   false);
      }
      else {
        data_ptr_cast<unsigned_short>(pBVar1->decompression_buffer);
        BitpackingPrimitives::UnPackBlock<unsigned_short>
                  ((data_ptr_t)in_stack_ffffffffffffff50,(data_ptr_t)in_stack_ffffffffffffff48,'\0',
                   false);
        memcpy(in_stack_ffffffffffffff48,pBVar1->decompression_buffer + uVar3,uVar4 << 1);
      }
      if ((pBVar1->current_group).mode == DELTA_FOR) {
        ApplyFrameOfReference<short>
                  ((short *)in_stack_ffffffffffffff48,pBVar1->current_frame_of_reference,uVar4);
        DeltaDecode<short>((short *)in_stack_ffffffffffffff48,pBVar1->current_delta_offset,uVar4);
        pBVar1->current_delta_offset = in_stack_ffffffffffffff48[uVar4 - 1];
      }
      else {
        ApplyFrameOfReference<unsigned_short>
                  (in_stack_ffffffffffffff48,pBVar1->current_frame_of_reference,uVar4);
      }
      local_48 = uVar4 + local_48;
      pBVar1->current_group_offset = uVar4 + pBVar1->current_group_offset;
    }
  }
  return;
}

Assistant:

void BitpackingScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                           idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<BitpackingScanState<T>>();

	T *result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	//! Because FOR offsets all our values to be 0 or above, we can always skip sign extension here
	bool skip_sign_extend = true;

	idx_t scanned = 0;
	while (scanned < scan_count) {
		D_ASSERT(scan_state.current_group_offset <= BITPACKING_METADATA_GROUP_SIZE);

		// Exhausted this metadata group, move pointers to next group and load metadata for next group.
		if (scan_state.current_group_offset == BITPACKING_METADATA_GROUP_SIZE) {
			scan_state.LoadNextGroup();
		}

		idx_t offset_in_compression_group =
		    scan_state.current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

		if (scan_state.current_group.mode == BitpackingMode::CONSTANT) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *begin = result_data + result_offset + scanned;
			T *end = begin + remaining;
			std::fill(begin, end, scan_state.current_constant);
			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		if (scan_state.current_group.mode == BitpackingMode::CONSTANT_DELTA) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *target_ptr = result_data + result_offset + scanned;

			for (idx_t i = 0; i < to_scan; i++) {
				idx_t multiplier = scan_state.current_group_offset + i;
				// intended static casts to unsigned and back for defined wrapping of integers
				target_ptr[i] = static_cast<T>((static_cast<T_U>(scan_state.current_constant) * multiplier) +
				                               static_cast<T_U>(scan_state.current_frame_of_reference));
			}

			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		D_ASSERT(scan_state.current_group.mode == BitpackingMode::FOR ||
		         scan_state.current_group.mode == BitpackingMode::DELTA_FOR);

		idx_t to_scan = MinValue<idx_t>(scan_count - scanned, BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE -
		                                                          offset_in_compression_group);
		// Calculate start of compression algorithm group
		data_ptr_t current_position_ptr =
		    scan_state.current_group_ptr + scan_state.current_group_offset * scan_state.current_width / 8;
		data_ptr_t decompression_group_start_pointer =
		    current_position_ptr - offset_in_compression_group * scan_state.current_width / 8;

		T *current_result_ptr = result_data + result_offset + scanned;

		if (to_scan == BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE && offset_in_compression_group == 0) {
			// Decompress directly into result vector
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(current_result_ptr), decompression_group_start_pointer,
			                                     scan_state.current_width, skip_sign_extend);
		} else {
			// Decompress compression algorithm to buffer
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(scan_state.decompression_buffer),
			                                     decompression_group_start_pointer, scan_state.current_width,
			                                     skip_sign_extend);

			memcpy(current_result_ptr, scan_state.decompression_buffer + offset_in_compression_group,
			       to_scan * sizeof(T));
		}

		if (scan_state.current_group.mode == BitpackingMode::DELTA_FOR) {
			ApplyFrameOfReference<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                           static_cast<T_S>(scan_state.current_frame_of_reference), to_scan);
			DeltaDecode<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                 static_cast<T_S>(scan_state.current_delta_offset), to_scan);
			scan_state.current_delta_offset = current_result_ptr[to_scan - 1];
		} else {
			ApplyFrameOfReference<T>(current_result_ptr, scan_state.current_frame_of_reference, to_scan);
		}

		scanned += to_scan;
		scan_state.current_group_offset += to_scan;
	}
}